

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall mjs::object::fixup(object *this)

{
  object *this_local;
  
  gc_heap_ptr_untracked<mjs::gc_string,_true>::fixup(&this->class_,this->heap_);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->prototype_,this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::fixup
            (&this->properties_,this->heap_);
  return;
}

Assistant:

void object::fixup() {
    class_.fixup(heap_);
    prototype_.fixup(heap_);
    properties_.fixup(heap_);
}